

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O0

FArchive * __thiscall FArchive::operator<<(FArchive *this,QWORD *w)

{
  QWORD QVar1;
  QWORD local_20;
  QWORD temp;
  QWORD *w_local;
  FArchive *this_local;
  
  temp = (QWORD)w;
  w_local = (QWORD *)this;
  if ((this->m_Storing & 1U) == 0) {
    (*this->_vptr_FArchive[3])(this,w,8);
    QVar1 = SWAP_QWORD(*(QWORD *)temp);
    *(QWORD *)temp = QVar1;
  }
  else {
    local_20 = SWAP_QWORD(*w);
    (*this->_vptr_FArchive[2])(this,&local_20,8);
  }
  return this;
}

Assistant:

FArchive &FArchive::operator<< (QWORD &w)
{
	if (m_Storing)
	{
		QWORD temp = SWAP_QWORD(w);
		Write (&temp, sizeof(QWORD));
	}
	else
	{
		Read (&w, sizeof(QWORD));
		w = SWAP_QWORD(w);
	}
	return *this;
}